

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O0

void __thiscall
TorController::auth_cb(TorController *this,TorControlConnection *_conn,TorControlReply *reply)

{
  long lVar1;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  bool bVar2;
  byte bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  int *in_RDX;
  TorControlConnection *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  char *in_stack_fffffffffffffdb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  _Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(TorControlConnection_&,_const_TorControlReply_&)>
  *in_stack_fffffffffffffdc0;
  function<void_(TorControlConnection_&,_const_TorControlReply_&)> *in_stack_fffffffffffffdc8;
  ReplyHandlerCB *in_stack_fffffffffffffdd0;
  string *in_stack_fffffffffffffdd8;
  string *cmd;
  TorControlConnection *in_stack_fffffffffffffde0;
  ArgsManager *in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  LogFlags in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe1c;
  ConstevalFormatString<0U> in_stack_fffffffffffffe58;
  size_t in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  size_t in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  undefined1 local_eb;
  undefined1 local_ea [58];
  Level in_stack_ffffffffffffff50;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*in_RDX == 0xfa) {
    bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),Trace)
    ;
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdc8,
                 (char *)in_stack_fffffffffffffdc0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdc8,
                 (char *)in_stack_fffffffffffffdc0);
      in_stack_fffffffffffffda8 = 1;
      in_stack_fffffffffffffdb0 = "Authentication successful\n";
      logging_function._M_str = in_stack_fffffffffffffe78;
      logging_function._M_len = in_stack_fffffffffffffe70;
      source_file._M_str = in_stack_fffffffffffffe68;
      source_file._M_len = in_stack_fffffffffffffe60;
      LogPrintFormatInternal<>
                (logging_function,source_file,in_stack_fffffffffffffe1c,in_stack_fffffffffffffe10,
                 in_stack_ffffffffffffff50,in_stack_fffffffffffffe58);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdf8,
               (char *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
               (allocator<char> *)in_stack_fffffffffffffde8);
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ea;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (pbVar4,(char *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
               (allocator<char> *)in_stack_fffffffffffffde8);
    ArgsManager::GetArg(in_stack_fffffffffffffde8,(string *)in_stack_fffffffffffffde0,
                        in_stack_fffffffffffffdd8);
    bVar3 = std::operator==(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    std::allocator<char>::~allocator((allocator<char> *)local_ea);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    std::allocator<char>::~allocator((allocator<char> *)(local_ea + 1));
    if ((bVar3 & 1) != 0) {
      in_stack_fffffffffffffde8 = (ArgsManager *)&local_eb;
      in_stack_fffffffffffffde0 = in_RSI;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (pbVar4,(char *)CONCAT17(bVar3,in_stack_fffffffffffffdf0),
                 (allocator<char> *)in_stack_fffffffffffffde8);
      std::
      bind<void(TorController::*)(TorControlConnection&,TorControlReply_const&),TorController*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
                (&in_stack_fffffffffffffdc0->_M_f,(TorController **)in_stack_fffffffffffffdb8,
                 (_Placeholder<1> *)in_stack_fffffffffffffdb0,
                 (_Placeholder<2> *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      std::function<void(TorControlConnection&,TorControlReply_const&)>::
      function<std::_Bind<void(TorController::*(TorController*,std::_Placeholder<1>,std::_Placeholder<2>))(TorControlConnection&,TorControlReply_const&)>,void>
                (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      TorControlConnection::Command
                (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
      std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>::~function
                ((function<void_(TorControlConnection_&,_const_TorControlReply_&)> *)
                 CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      std::allocator<char>::~allocator((allocator<char> *)&local_eb);
    }
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    if (bVar2) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    }
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0xe8);
    Params();
    CChainParams::GetDefaultPort
              ((CChainParams *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    cmd = (string *)(local_ea + 0x22);
    CService::ToStringAddrPort_abi_cxx11_((CService *)in_stack_fffffffffffffde0);
    tinyformat::format<std::__cxx11::string,unsigned_short,std::__cxx11::string>
              ((char *)in_stack_fffffffffffffde8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffde0,(unsigned_short *)cmd,pbVar4);
    std::
    bind<void(TorController::*)(TorControlConnection&,TorControlReply_const&),TorController*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
              (&in_stack_fffffffffffffdc0->_M_f,(TorController **)in_stack_fffffffffffffdb8,
               (_Placeholder<1> *)in_stack_fffffffffffffdb0,
               (_Placeholder<2> *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    std::function<void(TorControlConnection&,TorControlReply_const&)>::
    function<std::_Bind<void(TorController::*(TorController*,std::_Placeholder<1>,std::_Placeholder<2>))(TorControlConnection&,TorControlReply_const&)>,void>
              ((function<void_(TorControlConnection_&,_const_TorControlReply_&)> *)in_RSI,
               in_stack_fffffffffffffdc0);
    TorControlConnection::Command(in_stack_fffffffffffffde0,cmd,(ReplyHandlerCB *)pbVar4);
    std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>::~function
              ((function<void_(TorControlConnection_&,_const_TorControlReply_&)> *)
               CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdc8,
               (char *)in_stack_fffffffffffffdc0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdc8,
               (char *)in_stack_fffffffffffffdc0);
    logging_function_00._M_str = in_stack_fffffffffffffe78;
    logging_function_00._M_len = in_stack_fffffffffffffe70;
    source_file_00._M_str = in_stack_fffffffffffffe68;
    source_file_00._M_len = in_stack_fffffffffffffe60;
    LogPrintFormatInternal<>
              (logging_function_00,source_file_00,in_stack_fffffffffffffe1c,0x1d32b6c,
               in_stack_ffffffffffffff50,in_stack_fffffffffffffe58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TorController::auth_cb(TorControlConnection& _conn, const TorControlReply& reply)
{
    if (reply.code == 250) {
        LogDebug(BCLog::TOR, "Authentication successful\n");

        // Now that we know Tor is running setup the proxy for onion addresses
        // if -onion isn't set to something else.
        if (gArgs.GetArg("-onion", "") == "") {
            _conn.Command("GETINFO net/listeners/socks", std::bind(&TorController::get_socks_cb, this, std::placeholders::_1, std::placeholders::_2));
        }

        // Finally - now create the service
        if (private_key.empty()) { // No private key, generate one
            private_key = "NEW:ED25519-V3"; // Explicitly request key type - see issue #9214
        }
        // Request onion service, redirect port.
        // Note that the 'virtual' port is always the default port to avoid decloaking nodes using other ports.
        _conn.Command(strprintf("ADD_ONION %s Port=%i,%s", private_key, Params().GetDefaultPort(), m_target.ToStringAddrPort()),
            std::bind(&TorController::add_onion_cb, this, std::placeholders::_1, std::placeholders::_2));
    } else {
        LogPrintf("tor: Authentication failed\n");
    }
}